

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

void OpenMD::SquareMatrix3<double>::diagonalize
               (SquareMatrix3<double> *a,Vector3<double> *w,SquareMatrix3<double> *v)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  double (*padVar4) [3];
  double (*padVar5) [3];
  double *pdVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint j;
  double dVar12;
  double dVar13;
  RectMatrix<double,_3U,_3U> local_c0;
  Vector3<double> v_j;
  Vector3<double> v_k;
  Vector3<double> v_maxI;
  
  Vector<double,_3U>::Vector(&v_maxI.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&v_k.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&v_j.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::jacobi
            (&a->super_SquareMatrix<double,_3>,&w->super_Vector<double,_3U>,
             &v->super_SquareMatrix<double,_3>);
  dVar12 = (w->super_Vector<double,_3U>).data_[0];
  if (((dVar12 == (w->super_Vector<double,_3U>).data_[1]) &&
      (pdVar6 = (w->super_Vector<double,_3U>).data_ + 2, dVar12 == *pdVar6)) &&
     (!NAN(dVar12) && !NAN(*pdVar6))) {
    SquareMatrix<double,_3>::identity();
    operator=(v,(SquareMatrix<double,_3> *)&local_c0);
    return;
  }
  transpose((SquareMatrix3<double> *)&local_c0,v);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)v,&local_c0);
  padVar5 = v[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ + 2;
  uVar9 = 0;
  do {
    uVar11 = uVar9;
    padVar4 = padVar5;
    uVar7 = (uint)uVar11;
    if (uVar7 == 3) {
      dVar12 = ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]);
      uVar9 = 0;
      uVar7 = 1;
      for (lVar8 = 0x18; lVar8 != 0x48; lVar8 = lVar8 + 0x18) {
        dVar13 = ABS(*(double *)
                      ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                             data_[0] + lVar8));
        if (dVar12 < dVar13) {
          uVar9 = (ulong)uVar7;
          dVar12 = dVar13;
        }
        uVar7 = uVar7 + 1;
      }
      if ((uint)uVar9 != 0) {
        dVar12 = (w->super_Vector<double,_3U>).data_[uVar9];
        (w->super_Vector<double,_3U>).data_[uVar9] = (w->super_Vector<double,_3U>).data_[0];
        (w->super_Vector<double,_3U>).data_[0] = dVar12;
        RectMatrix<double,_3U,_3U>::swapRow((RectMatrix<double,_3U,_3U> *)v,(uint)uVar9,0);
      }
      if (ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1]) <
          ABS((v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1])) {
        dVar12 = (w->super_Vector<double,_3U>).data_[1];
        (w->super_Vector<double,_3U>).data_[1] = (w->super_Vector<double,_3U>).data_[2];
        (w->super_Vector<double,_3U>).data_[2] = dVar12;
        RectMatrix<double,_3U,_3U>::swapRow((RectMatrix<double,_3U,_3U> *)v,2,1);
      }
      pdVar6 = (double *)v;
      for (lVar8 = 0x10; lVar8 != 0x40; lVar8 = lVar8 + 0x18) {
        if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
          puVar1 = (ulong *)((long)((v->super_SquareMatrix<double,_3>).
                                    super_RectMatrix<double,_3U,_3U>.data_ + -1) + 8 + lVar8);
          uVar9 = puVar1[1];
          puVar2 = (ulong *)((long)((v->super_SquareMatrix<double,_3>).
                                    super_RectMatrix<double,_3U,_3U>.data_ + -1) + 8 + lVar8);
          *puVar2 = *puVar1 ^ 0x8000000000000000;
          puVar2[1] = uVar9 ^ 0x8000000000000000;
          *(ulong *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                           [0] + lVar8) =
               *(ulong *)((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                                data_[0] + lVar8) ^ 0x8000000000000000;
        }
        pdVar6 = pdVar6 + 4;
      }
      dVar12 = determinant(v);
      if (dVar12 < 0.0) {
        dVar12 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
        (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] =
             -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
        (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] = -dVar12;
        (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] =
             -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
      }
      goto LAB_0016c47c;
    }
    uVar9 = uVar11 + 1;
    uVar10 = uVar9 & 0xffffffff;
    if (uVar7 == 2) {
      uVar10 = 0;
    }
    dVar12 = (w->super_Vector<double,_3U>).data_[uVar10];
    uVar10 = (ulong)(uVar7 - 1);
    if (uVar7 == 0) {
      uVar10 = 2;
    }
    padVar5 = padVar4 + 1;
    pdVar6 = (w->super_Vector<double,_3U>).data_ + uVar10;
  } while ((dVar12 != *pdVar6) || (NAN(dVar12) || NAN(*pdVar6)));
  dVar12 = ABS((*padVar5)[0]);
  pdVar6 = (double *)((long)(padVar4 + 1) + 8);
  j = 0;
  for (lVar8 = -2; lVar8 != 0; lVar8 = lVar8 + 1) {
    dVar13 = ABS(*pdVar6);
    uVar3 = (int)lVar8 + 3;
    if (ABS(*pdVar6) <= dVar12) {
      dVar13 = dVar12;
      uVar3 = j;
    }
    j = uVar3;
    dVar12 = dVar13;
    pdVar6 = pdVar6 + 1;
  }
  uVar10 = (ulong)j;
  if (j + 1 != (int)uVar9) {
    dVar12 = (w->super_Vector<double,_3U>).data_[uVar10];
    (w->super_Vector<double,_3U>).data_[uVar10] = (w->super_Vector<double,_3U>).data_[uVar11];
    (w->super_Vector<double,_3U>).data_[uVar11] = dVar12;
    RectMatrix<double,_3U,_3U>::swapRow((RectMatrix<double,_3U,_3U> *)v,uVar7,j);
  }
  pdVar6 = (double *)
           ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
           uVar10 * 0x20);
  if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
    padVar5 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar10;
    dVar12 = (*padVar5)[1];
    padVar4 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar10;
    (*padVar4)[0] = -(*padVar5)[0];
    (*padVar4)[1] = -dVar12;
    (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar10][2] =
         -(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar10][2];
  }
  uVar9 = (long)(int)(j + 1) % 3;
  uVar11 = uVar9 & 0xffffffff;
  (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[uVar11][2] = 0.0;
  padVar5 = (v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar11;
  (*padVar5)[0] = 0.0;
  (*padVar5)[1] = 0.0;
  *(undefined8 *)
   ((long)(v->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + uVar11 * 0x20)
       = 0x3ff0000000000000;
  RectMatrix<double,_3U,_3U>::getRow
            ((Vector<double,_3U> *)&local_c0,(RectMatrix<double,_3U,_3U> *)v,j);
  Vector3<double>::operator=(&v_maxI,(Vector<double,_3U> *)&local_c0);
  uVar7 = (uint)uVar9;
  RectMatrix<double,_3U,_3U>::getRow
            ((Vector<double,_3U> *)&local_c0,(RectMatrix<double,_3U,_3U> *)v,uVar7);
  Vector3<double>::operator=
            ((Vector3<double> *)&v_j.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_c0);
  cross<double>((Vector3<double> *)&local_c0,&v_maxI,
                (Vector3<double> *)&v_j.super_Vector<double,_3U>);
  Vector<double,_3U>::operator=(&v_k.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_c0);
  Vector<double,_3U>::normalize(&v_k.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&local_c0,(Vector3<double> *)&v_k.super_Vector<double,_3U>,
                &v_maxI);
  Vector<double,_3U>::operator=(&v_j.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_c0);
  RectMatrix<double,_3U,_3U>::setRow
            ((RectMatrix<double,_3U,_3U> *)v,uVar7,&v_j.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::setRow
            ((RectMatrix<double,_3U,_3U> *)v,(int)(j + 2) % 3,&v_k.super_Vector<double,_3U>);
LAB_0016c47c:
  transpose((SquareMatrix3<double> *)&local_c0,v);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)v,&local_c0);
  return;
}

Assistant:

void SquareMatrix3<Real>::diagonalize(SquareMatrix3<Real>& a,
                                        Vector3<Real>& w,
                                        SquareMatrix3<Real>& v) {
    int i, j, k, maxI;
    Real tmp, maxVal;
    Vector3<Real> v_maxI, v_k, v_j;

    // diagonalize using Jacobi
    SquareMatrix3<Real>::jacobi(a, w, v);
    // if all the eigenvalues are the same, return identity matrix
    if (w[0] == w[1] && w[0] == w[2]) {
      v = SquareMatrix3<Real>::identity();
      return;
    }

    // transpose temporarily, it makes it easier to sort the eigenvectors
    v = v.transpose();

    // if two eigenvalues are the same, re-orthogonalize to optimally line
    // up the eigenvectors with the x, y, and z axes
    for (i = 0; i < 3; i++) {
      if (w((i + 1) % 3) == w((i + 2) % 3)) {  // two eigenvalues are the same
        // find maximum element of the independant eigenvector
        maxVal = fabs(v(i, 0));
        maxI   = 0;
        for (j = 1; j < 3; j++) {
          if (maxVal < (tmp = fabs(v(i, j)))) {
            maxVal = tmp;
            maxI   = j;
          }
        }

        // swap the eigenvector into its proper position
        if (maxI != i) {
          tmp     = w(maxI);
          w(maxI) = w(i);
          w(i)    = tmp;

          v.swapRow(i, maxI);
        }
        // maximum element of eigenvector should be positive
        if (v(maxI, maxI) < 0) {
          v(maxI, 0) = -v(maxI, 0);
          v(maxI, 1) = -v(maxI, 1);
          v(maxI, 2) = -v(maxI, 2);
        }

        // re-orthogonalize the other two eigenvectors
        j = (maxI + 1) % 3;
        k = (maxI + 2) % 3;

        v(j, 0) = 0.0;
        v(j, 1) = 0.0;
        v(j, 2) = 0.0;
        v(j, j) = 1.0;

        /** @todo */
        v_maxI = v.getRow(maxI);
        v_j    = v.getRow(j);
        v_k    = cross(v_maxI, v_j);
        v_k.normalize();
        v_j = cross(v_k, v_maxI);
        v.setRow(j, v_j);
        v.setRow(k, v_k);

        // transpose vectors back to columns
        v = v.transpose();
        return;
      }
    }

    // the three eigenvalues are different, just sort the eigenvectors
    // to align them with the x, y, and z axes

    // find the vector with the largest x element, make that vector
    // the first vector
    maxVal = fabs(v(0, 0));
    maxI   = 0;
    for (i = 1; i < 3; i++) {
      if (maxVal < (tmp = fabs(v(i, 0)))) {
        maxVal = tmp;
        maxI   = i;
      }
    }

    // swap eigenvalue and eigenvector
    if (maxI != 0) {
      tmp     = w(maxI);
      w(maxI) = w(0);
      w(0)    = tmp;
      v.swapRow(maxI, 0);
    }
    // do the same for the y element
    if (fabs(v(1, 1)) < fabs(v(2, 1))) {
      tmp  = w(2);
      w(2) = w(1);
      w(1) = tmp;
      v.swapRow(2, 1);
    }

    // ensure that the sign of the eigenvectors is correct
    for (i = 0; i < 2; i++) {
      if (v(i, i) < 0) {
        v(i, 0) = -v(i, 0);
        v(i, 1) = -v(i, 1);
        v(i, 2) = -v(i, 2);
      }
    }

    // set sign of final eigenvector to ensure that determinant is positive
    if (v.determinant() < 0) {
      v(2, 0) = -v(2, 0);
      v(2, 1) = -v(2, 1);
      v(2, 2) = -v(2, 2);
    }

    // transpose the eigenvectors back again
    v = v.transpose();
    return;
  }